

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void solver_updated_cb(int remaining_constraints,double value,long loop,double duration,
                      long reinit_number)

{
  long local_38;
  long local_30;
  long reinit_number_local;
  double duration_local;
  long loop_local;
  double value_local;
  int remaining_constraints_local;
  
  local_30 = reinit_number;
  reinit_number_local = (long)duration;
  duration_local = (double)loop;
  loop_local = (long)value;
  value_local._4_4_ = remaining_constraints;
  if (remaining_constraints < 1) {
    if (loop < 0) {
      local_38 = -loop;
      fmt::v7::print<char[64],double&,long,double&,long&,char>
                ((char (*) [64])"  - Solution found via push: {:f} (loop: {} t: {}s reinit: {})\n",
                 (double *)&loop_local,&local_38,(double *)&reinit_number_local,&local_30);
    }
    else {
      fmt::v7::print<char[55],double&,long&,double&,long&,char>
                ((char (*) [55])"  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n",
                 (double *)&loop_local,(long *)&duration_local,(double *)&reinit_number_local,
                 &local_30);
    }
  }
  else {
    fmt::v7::print<char[60],int&,long&,double&,long&,char>
              ((char (*) [60])"  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n",
               (int *)((long)&value_local + 4),(long *)&duration_local,
               (double *)&reinit_number_local,&local_30);
  }
  return;
}

Assistant:

static void
solver_updated_cb(int remaining_constraints,
                  double value,
                  long int loop,
                  double duration,
                  long int reinit_number)
{
    if (remaining_constraints > 0) {
        fmt::print(
          "  - Constraints remaining: {} (loop: {} t: {}s reinit: {})\n",
          remaining_constraints,
          loop,
          duration,
          reinit_number);
    } else {
        if (loop >= 0)
            fmt::print(
              "  - Solution found: {:f} (loop: {} t: {}s reinit: {})\n",
              value,
              loop,
              duration,
              reinit_number);
        else
            fmt::print("  - Solution found via push: {:f} (loop: {} t: {}s "
                       "reinit: {})\n",
                       value,
                       -loop,
                       duration,
                       reinit_number);
    }
}